

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

node_t_conflict copy_node(c2m_ctx_t c2m_ctx,node_t_conflict n)

{
  node_t_conflict pnVar1;
  pos_t pos;
  node_t_conflict n_local;
  c2m_ctx_t c2m_ctx_local;
  
  pos = get_node_pos(c2m_ctx,n);
  pnVar1 = copy_node_with_pos(c2m_ctx,n,pos);
  return pnVar1;
}

Assistant:

static node_t copy_node (c2m_ctx_t c2m_ctx, node_t n) {
  return copy_node_with_pos (c2m_ctx, n, POS (n));
}